

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gpnp4::sPolynomial15
               (Matrix<double,_25,_37,_0,_25,_37> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x201];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x5a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x21a] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x21b];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x122] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x2b1] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x186] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x2ca] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x19f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x2e3] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x1b8] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2b0] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2fc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x1d1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2c9] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x1ea] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2e2] / dVar1;
  dVar3 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).
          m_storage.m_data.array[0x314];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x203] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x2fb] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x315] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x21c] = dVar3 / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x280] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x32e] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x299] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x347] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2b2] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x360] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2cb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x32d] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2e4] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x346] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x2fd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x35f] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x379] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x316] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x378] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x361] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage
        .m_data.array[0x392] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
  m_data.array[0x37a] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_25,_37,_0,_25,_37>_>).m_storage.
       m_data.array[0x391] / dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gpnp4::sPolynomial15( Eigen::Matrix<double,25,37> & groebnerMatrix )
{
  groebnerMatrix(15,3) = groebnerMatrix(13,21)/(groebnerMatrix(13,20));
  groebnerMatrix(15,11) = -groebnerMatrix(14,27)/(groebnerMatrix(14,21));
  groebnerMatrix(15,15) = -groebnerMatrix(14,28)/(groebnerMatrix(14,21));
  groebnerMatrix(15,16) = -groebnerMatrix(14,29)/(groebnerMatrix(14,21));
  groebnerMatrix(15,17) = (groebnerMatrix(13,27)/(groebnerMatrix(13,20))-groebnerMatrix(14,30)/(groebnerMatrix(14,21)));
  groebnerMatrix(15,18) = groebnerMatrix(13,28)/(groebnerMatrix(13,20));
  groebnerMatrix(15,19) = groebnerMatrix(13,29)/(groebnerMatrix(13,20));
  groebnerMatrix(15,20) = (groebnerMatrix(13,30)/(groebnerMatrix(13,20))-groebnerMatrix(14,31)/(groebnerMatrix(14,21)));
  groebnerMatrix(15,21) = groebnerMatrix(13,31)/(groebnerMatrix(13,20));
  groebnerMatrix(15,25) = -groebnerMatrix(14,32)/(groebnerMatrix(14,21));
  groebnerMatrix(15,26) = -groebnerMatrix(14,33)/(groebnerMatrix(14,21));
  groebnerMatrix(15,27) = -groebnerMatrix(14,34)/(groebnerMatrix(14,21));
  groebnerMatrix(15,28) = groebnerMatrix(13,32)/(groebnerMatrix(13,20));
  groebnerMatrix(15,29) = groebnerMatrix(13,33)/(groebnerMatrix(13,20));
  groebnerMatrix(15,30) = (groebnerMatrix(13,34)/(groebnerMatrix(13,20))-groebnerMatrix(14,35)/(groebnerMatrix(14,21)));
  groebnerMatrix(15,31) = groebnerMatrix(13,35)/(groebnerMatrix(13,20));
  groebnerMatrix(15,34) = -groebnerMatrix(14,36)/(groebnerMatrix(14,21));
  groebnerMatrix(15,35) = groebnerMatrix(13,36)/(groebnerMatrix(13,20));
}